

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
::resize(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_phmap::priv::(anonymous_namespace)::CustomAlloc<long>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  CustomAlloc<long> *alloc;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  char *p;
  CopyConst<char,_ElementType<0UL>_> *pCVar3;
  CopyConst<char,_ElementType<1UL>_> *pCVar4;
  ulong uVar5;
  size_t i;
  size_t sVar6;
  FindInfo FVar7;
  Layout LVar8;
  LayoutType<sizeof___(Ts),_signed_char,_long> local_40;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, phmap::Hash<int64_t>, std::equal_to<long>, phmap::priv::(anonymous namespace)::CustomAlloc<long>>::resize(size_t) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = phmap::Hash<int64_t>, Eq = std::equal_to<long>, Alloc = phmap::priv::(anonymous namespace)::CustomAlloc<long>]"
                 );
  }
  alloc = (CustomAlloc<long> *)this->ctrl_;
  psVar1 = this->slots_;
  capacity = this->capacity_;
  local_40.size_ = (size_t  [2])MakeLayout(new_capacity);
  uVar5 = local_40.size_[1] * 8 + (local_40.size_[0] + 7 & 0xfffffffffffffff8);
  if (uVar5 == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x105d,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = phmap::priv::(anonymous namespace)::CustomAlloc<long>]"
                 );
  }
  if (-1 < (long)uVar5) {
    p = (char *)operator_new(uVar5);
    if (((ulong)p & 7) == 0) {
      pCVar3 = internal_layout::
               LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
               ::Pointer<0ul,char>((LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)&local_40,p);
      this->ctrl_ = pCVar3;
      pCVar4 = internal_layout::
               LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
               ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)&local_40,p);
      this->slots_ = pCVar4;
      memset(this->ctrl_,0x80,new_capacity + 0x10);
      this->ctrl_[new_capacity] = -1;
      reset_growth_left(this,new_capacity);
      this->capacity_ = new_capacity;
      for (sVar6 = 0; capacity != sVar6; sVar6 = sVar6 + 1) {
        if (-1 < (char)alloc[sVar6]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = psVar1[sVar6];
          hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                    SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
          FVar7 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar7.offset,(byte)hashval & 0x7f);
          this->slots_[FVar7.offset] = psVar1[sVar6];
        }
      }
      if (capacity != 0) {
        LVar8 = MakeLayout(capacity);
        Deallocate<8ul,phmap::priv::(anonymous_namespace)::CustomAlloc<long>>
                  (alloc,(void *)((LVar8.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[0]
                                   + 7 & 0xfffffffffffffff8) +
                                 LVar8.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] *
                                 8),
                   LVar8.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1]);
      }
      return;
    }
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x1064,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = phmap::priv::(anonymous namespace)::CustomAlloc<long>]"
                 );
  }
  std::__throw_bad_alloc();
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }